

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
HdmiCecSimulationDataGenerator::GenBit(HdmiCecSimulationDataGenerator *this,bool value,bool ackBit)

{
  undefined3 in_register_00000011;
  undefined7 in_register_00000031;
  float msecs;
  
  if ((int)CONCAT71(in_register_00000031,value) == CONCAT31(in_register_00000011,ackBit)) {
    msecs = 1.5;
  }
  else {
    msecs = 0.6;
  }
  SimulationChannelDescriptor::TransitionIfNeeded((int)this + 0x10);
  Advance(this,msecs);
  SimulationChannelDescriptor::Transition();
  Advance(this,2.4 - msecs);
  return;
}

Assistant:

void HdmiCecSimulationDataGenerator::GenBit( bool value, bool ackBit )
{
    // Timing values are inverted for the follower-asserted ACK bit
    if( ackBit )
        value = !value;
    // Timing values from CEC 1.3a section 5.2.2 "Data Bit Timing"
    const float risingTime = value ? HdmiCec::Tim_Bit_One : HdmiCec::Tim_Bit_Zero;

    // We should be in LOW
    mCecSimulationData.TransitionIfNeeded( BIT_LOW );

    Advance( risingTime );
    mCecSimulationData.Transition(); // LOW to HIGH

    Advance( HdmiCec::Tim_Bit_Len - risingTime );
}